

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O3

void __thiscall
CConsoleNetConnection::Init(CConsoleNetConnection *this,NETSOCKET Socket,NETADDR_conflict *pAddr)

{
  undefined8 uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  
  this->m_State = 0;
  mem_zero(&this->m_PeerAddr,0x18);
  this->m_aErrorString[0] = '\0';
  this->m_aBuffer[0] = '\0';
  this->m_BufferOffset = 0;
  this->m_LineEndingDetected = false;
  this->m_aLineEnding[0] = '\n';
  this->m_aLineEnding[1] = '\0';
  this->m_aLineEnding[2] = '\0';
  (this->m_Socket).type = (int)Socket._0_8_;
  (this->m_Socket).ipv4sock = (int)((ulong)Socket._0_8_ >> 0x20);
  (this->m_Socket).ipv6sock = Socket.ipv6sock;
  net_set_non_blocking(Socket);
  uVar2 = pAddr->ip[0];
  uVar3 = pAddr->ip[1];
  uVar4 = pAddr->ip[2];
  uVar5 = pAddr->ip[3];
  uVar1 = *(undefined8 *)(pAddr->ip + 4);
  (this->m_PeerAddr).type = pAddr->type;
  (this->m_PeerAddr).ip[0] = uVar2;
  (this->m_PeerAddr).ip[1] = uVar3;
  (this->m_PeerAddr).ip[2] = uVar4;
  (this->m_PeerAddr).ip[3] = uVar5;
  *(undefined8 *)((this->m_PeerAddr).ip + 4) = uVar1;
  *(undefined8 *)((this->m_PeerAddr).ip + 0xc) = *(undefined8 *)(pAddr->ip + 0xc);
  this->m_State = 4;
  return;
}

Assistant:

void CConsoleNetConnection::Init(NETSOCKET Socket, const NETADDR *pAddr)
{
	Reset();

	m_Socket = Socket;
	net_set_non_blocking(m_Socket);

	m_PeerAddr = *pAddr;
	m_State = NET_CONNSTATE_ONLINE;
}